

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O2

Input * __thiscall
helics::ValueFederateManager::getInputByTarget(ValueFederateManager *this,string_view key)

{
  bool bVar1;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>
  pVar2;
  handle inps;
  BlockIterator<helics::Input,_32,_helics::Input_**> ret;
  shared_handle TIDhandle;
  undefined1 local_98 [32];
  BlockIterator<helics::Input,_32,_helics::Input_**> local_78;
  shared_handle local_60;
  const_iterator local_48;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  local_30._M_str = key._M_str;
  local_30._M_len = key._M_len;
  gmlc::libguarded::
  shared_guarded_opt<std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>,_std::shared_mutex>
  ::lock_shared(&local_60,&this->targetIDs);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_98,&local_30,(allocator<char> *)&local_78);
  pVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>
          ::equal_range(&(local_60.data)->_M_t,(key_type *)local_98);
  std::__cxx11::string::~string((string *)local_98);
  if (pVar2.first._M_node._M_node != pVar2.second._M_node._M_node) {
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
    ::lock((handle *)local_98,&this->inputs);
    gmlc::containers::
    DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>::find
              (&local_78,
               (DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>
                *)local_98._0_8_,(InterfaceHandle *)(pVar2.first._M_node._M_node + 2));
    gmlc::containers::StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::end
              (&local_48,
               (StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_> *)
               local_98._0_8_);
    bVar1 = gmlc::containers::BlockIterator<helics::Input,32,helics::Input**>::operator!=
                      ((BlockIterator<helics::Input,32,helics::Input**> *)&local_78,&local_48);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(local_98 + 8));
    if (bVar1) goto LAB_00205ce4;
  }
  local_78.ptr = (Input *)invalidIptNC;
LAB_00205ce4:
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_60.m_handle_lock);
  return local_78.ptr;
}

Assistant:

Input& ValueFederateManager::getInputByTarget(std::string_view key)
{
    auto TIDhandle = targetIDs.lock_shared();
    auto res = TIDhandle->equal_range(std::string(key));
    if (res.first != res.second) {
        auto inps = inputs.lock();
        auto ret = inps->find(res.first->second);
        if (ret != inps->end()) {
            return *ret;
        }
    }
    return invalidIptNC;
}